

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void DumpGraph(RegVmLoweredModule *lowModule)

{
  undefined1 local_2290 [8];
  InstructionRegVmLowerGraphContext instLowerGraphCtx;
  undefined1 local_2258 [8];
  char tempBuf [4096];
  char outputBuf [4096];
  undefined1 local_250 [8];
  OutputContext outputCtx;
  RegVmLoweredModule *lowModule_local;
  
  outputCtx.closeStream = (_func_void_void_ptr *)lowModule;
  OutputContext::OutputContext((OutputContext *)local_250);
  outputCtx.outputBufDef._248_8_ = tempBuf + 0xff8;
  outputCtx.outputBuf._0_4_ = 0x1000;
  outputCtx.tempBufDef._248_8_ = local_2258;
  outputCtx.tempBuf._0_4_ = 0x1000;
  outputCtx._536_8_ = OutputContext::FileOpen("inst_graph_reg_low.txt");
  outputCtx.openStream = OutputContext::FileWrite;
  InstructionRegVmLowerGraphContext::InstructionRegVmLowerGraphContext
            ((InstructionRegVmLowerGraphContext *)local_2290,(OutputContext *)local_250);
  instLowerGraphCtx.lastStartOffset._0_1_ = 1;
  PrintGraph((InstructionRegVmLowerGraphContext *)local_2290,
             (RegVmLoweredModule *)outputCtx.closeStream);
  OutputContext::FileClose((void *)outputCtx._536_8_);
  outputCtx.tempBufSize = 0;
  outputCtx._540_4_ = 0;
  OutputContext::~OutputContext((OutputContext *)local_250);
  return;
}

Assistant:

void DumpGraph(RegVmLoweredModule *lowModule)
{
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("inst_graph_reg_low.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	InstructionRegVmLowerGraphContext instLowerGraphCtx(outputCtx);

	instLowerGraphCtx.showSource = true;

	PrintGraph(instLowerGraphCtx, lowModule);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}